

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::makeBlob(JSON *this,function<void_(Pipeline_*)> *fn)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar1;
  undefined1 local_28 [8];
  unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> local_20;
  function<void_(Pipeline_*)> *local_18;
  function<void_(Pipeline_*)> *fn_local;
  
  local_18 = fn;
  fn_local = (function<void_(Pipeline_*)> *)this;
  std::make_unique<JSON::JSON_blob,std::function<void(Pipeline*)>&>
            ((function<void_(Pipeline_*)> *)local_28);
  std::unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>>::
  unique_ptr<JSON::JSON_blob,std::default_delete<JSON::JSON_blob>,void>
            ((unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>> *)&local_20,
             (unique_ptr<JSON::JSON_blob,_std::default_delete<JSON::JSON_blob>_> *)local_28);
  JSON(this,&local_20);
  std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::~unique_ptr(&local_20);
  std::unique_ptr<JSON::JSON_blob,_std::default_delete<JSON::JSON_blob>_>::~unique_ptr
            ((unique_ptr<JSON::JSON_blob,_std::default_delete<JSON::JSON_blob>_> *)local_28);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeBlob(std::function<void(Pipeline*)> fn)
{
    return {std::make_unique<JSON_blob>(fn)};
}